

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint64_t fletcher2(char *key,int len,uint64_t seed)

{
  byte *pbVar1;
  int iVar2;
  uint64_t uVar3;
  long *plVar4;
  long lVar5;
  uint64_t *dataw;
  char *pcVar6;
  
  iVar2 = len + 7;
  if (-1 < len) {
    iVar2 = len;
  }
  plVar4 = (long *)key;
  pcVar6 = key;
  if (len < 8) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      seed = seed + *plVar4;
      plVar4 = plVar4 + 1;
      pcVar6 = pcVar6 + 8;
      uVar3 = uVar3 + seed;
    } while (plVar4 < key + (long)(iVar2 >> 3) * 8);
  }
  if (((len & 7U) != 0) && (plVar4 < key + len)) {
    lVar5 = 0;
    do {
      pbVar1 = (byte *)((long)plVar4 + lVar5);
      lVar5 = lVar5 + 1;
      seed = seed + *pbVar1;
      uVar3 = uVar3 + seed;
    } while ((long)(key + len) - (long)pcVar6 != lVar5);
  }
  return uVar3;
}

Assistant:

uint64_t
fletcher2(const char *key, int len, uint64_t seed)
{
  uint64_t *dataw = (uint64_t *)key;
  const uint64_t *const endw = &((const uint64_t*)key)[len/8];
  uint64_t A = seed, B = 0;
  for (; dataw < endw; dataw++) {
    A += *dataw;
    B += A;
  }
  if (len & 7) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    for (; datac < endc; datac++) {
      A += *datac;
      B += A;
    }
  }
  return B;
}